

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O3

Value * getOutput(Value *__return_storage_ptr__,string *str)

{
  char cVar1;
  istream *piVar2;
  Value *other;
  string line;
  string s;
  Value ans;
  Reader reader;
  ifstream fin;
  undefined1 *local_3b0;
  undefined8 local_3a8;
  undefined1 local_3a0 [16];
  string local_390;
  Value local_370;
  Reader local_348;
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,(string *)str,_S_in);
  Json::Value::Value(&local_370,nullValue);
  local_3a8 = 0;
  local_3a0[0] = 0;
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_3b0 = local_3a0;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3b0,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_3b0);
  }
  std::ifstream::close();
  Json::Reader::Reader(&local_348);
  Json::Reader::parse(&local_348,&local_390,&local_370,true);
  other = Json::Value::operator[](&local_370,"response");
  Json::Value::Value(__return_storage_ptr__,other);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.commentsBefore_._M_dataplus._M_p != &local_348.commentsBefore_.field_2) {
    operator_delete(local_348.commentsBefore_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.document_._M_dataplus._M_p != &local_348.document_.field_2) {
    operator_delete(local_348.document_._M_dataplus._M_p);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_348.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if (local_3b0 != local_3a0) {
    operator_delete(local_3b0);
  }
  Json::Value::~Value(&local_370);
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

Json::Value getOutput(string str)
{
    ifstream fin(str);
    Json::Value ans;
    string line, s;
    while (getline(fin, line))
        s += line;
    fin.close();
    Json::Reader reader;
    reader.parse(s, ans);
    return ans["response"];
}